

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O3

int __thiscall Fl_Tree_Item::event_on_collapse_icon(Fl_Tree_Item *this,Fl_Tree_Prefs *prefs)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = 0;
  if ((((this->_visible != '\0') && (this->_active != '\0')) && ((this->_children)._total != 0)) &&
     (uVar1 = 0, prefs->_showcollapse != '\0')) {
    iVar2 = Fl::event_inside(this->_collapse_xywh[0],this->_collapse_xywh[1],this->_collapse_xywh[2]
                             ,this->_collapse_xywh[3]);
    uVar1 = (uint)(iVar2 != 0);
  }
  return uVar1;
}

Assistant:

int Fl_Tree_Item::event_on_collapse_icon(const Fl_Tree_Prefs &prefs) const {
  if ( is_visible() && is_active() && has_children() && prefs.showcollapse() ) {
    return(event_inside(_collapse_xywh) ? 1 : 0);
  } else {
    return(0);
  }
}